

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::(anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  Type TVar1;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar1 == TYPE_GROUP) {
    this = (_anonymous_namespace_ *)FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,*(string **)this);
  return __return_storage_ptr__;
}

Assistant:

string NameFromFieldDescriptor(const FieldDescriptor* field) {
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    return field->message_type()->name();
  } else {
    return field->name();
  }
}